

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O1

void print_buf(fdb_kvs_handle *db,void *buf,size_t buflen,bool hex,int align)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (buf == (void *)0x0) {
    puts("(null)");
    return;
  }
  if (!hex) {
    printf("%.*s\n",buflen & 0xffffffff,buf);
    return;
  }
  puts("(hex)");
  if (buflen != 0) {
    uVar3 = 0;
    do {
      printf("        ");
      uVar1 = (long)align + uVar3;
      lVar4 = (long)align;
      uVar5 = uVar3;
      if (uVar3 < uVar1) {
        do {
          if (uVar5 < buflen) {
            printf("%02x ",(ulong)*(byte *)((long)buf + uVar5));
          }
          else {
            printf("   ");
          }
          if (((int)uVar5 + 1U & 7) == 0) {
            putchar(0x20);
          }
          lVar4 = lVar4 + -1;
          uVar5 = uVar5 + 1;
        } while (lVar4 != 0);
      }
      putchar(0x20);
      sVar6 = buflen;
      if (uVar1 < buflen) {
        sVar6 = uVar1;
      }
      for (; uVar3 < sVar6; uVar3 = uVar3 + 1) {
        bVar2 = *(byte *)((long)buf + uVar3);
        if (0x5d < (byte)(bVar2 - 0x20)) {
          bVar2 = 0x2e;
        }
        putchar((uint)bVar2);
      }
      putchar(10);
      uVar3 = uVar1;
    } while (uVar1 < buflen);
  }
  return;
}

Assistant:

INLINE void print_buf(fdb_kvs_handle *db, void *buf, size_t buflen, bool hex,
                      int align)
{
    if (buf) {
        if (!hex) {
            // plaintext
            printf("%.*s\n", (int)buflen, (char*)buf);
        } else {
            // hex dump
            size_t i, j;
            printf("(hex)\n");
            for (i=0;i<buflen;i+=align) {
                printf("        ");
                for (j=i; j<i+align; ++j){
                    if (j<buflen) {
                        printf("%02x ", ((uint8_t*)buf)[j]);
                    } else {
                        printf("   ");
                    }
                    if ((j+1)%8 == 0) {
                        printf(" ");
                    }
                }
                printf(" ");
                for (j=i; j<i+align && j<buflen; ++j){
                    // print only readable ascii character
                    printf("%c",
                     (0x20 <= ((char*)buf)[j] && ((char*)buf)[j] <= 0x7d)?
                               ((char*)buf)[j] : '.'  );
                }
                printf("\n");
            }
        }
    } else {
        printf("(null)\n");
    }
}